

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,ExtPrivkey *ext_privkey,string *parent_key_information,
          string *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->key_type_ = kDescriptorKeyBip32Priv;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_,ext_privkey);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  (this->parent_info_)._M_dataplus._M_p = (pointer)&(this->parent_info_).field_2;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->key_string_)._M_dataplus._M_p = (pointer)&(this->key_string_).field_2;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  if (parent_key_information->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  }
  if (path->_M_string_length != 0) {
    if (*(path->_M_dataplus)._M_p == '/') {
      ::std::__cxx11::string::_M_assign((string *)&this->path_);
    }
    else {
      ::std::operator+(&local_50,"/",path);
      ::std::__cxx11::string::operator=((string *)&this->path_,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const ExtPrivkey& ext_privkey, const std::string parent_key_information,
    const std::string path)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32Priv),
      extprivkey_(ext_privkey) {
  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
  if (!path.empty()) {
    if (path[0] != '/') {
      path_ = "/" + path;
    } else {
      path_ = path;
    }
  }
}